

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiString *pString)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *msg;
  
  uVar1 = pString->length;
  if (0x400 < uVar1) {
    ReportError(this,"aiString::length is too large (%u, maximum is %lu)",(ulong)uVar1,0x400);
  }
  if (pString->data[0] == '\0') {
    lVar4 = 0;
  }
  else {
    lVar3 = 0;
    do {
      if (lVar3 == 0x400) {
        msg = "aiString::data is invalid. There is no terminal character";
        goto LAB_0030406c;
      }
      lVar4 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar4;
    } while (pString->data[lVar2] != '\0');
  }
  if (uVar1 == (uint)lVar4) {
    return;
  }
  msg = "aiString::data is invalid: the terminal zero is at a wrong offset";
LAB_0030406c:
  ReportError(this,msg);
}

Assistant:

void ValidateDSProcess::Validate( const aiString* pString)
{
    if (pString->length > MAXLEN)
    {
        ReportError("aiString::length is too large (%u, maximum is %lu)",
            pString->length,MAXLEN);
    }
    const char* sz = pString->data;
    while (true)
    {
        if ('\0' == *sz)
        {
            if (pString->length != (unsigned int)(sz-pString->data)) {
                ReportError("aiString::data is invalid: the terminal zero is at a wrong offset");
            }
            break;
        }
        else if (sz >= &pString->data[MAXLEN]) {
            ReportError("aiString::data is invalid. There is no terminal character");
        }
        ++sz;
    }
}